

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfonts.cpp
# Opt level: O1

void test_font_variety(wins *wins_ar,int ar_len,Am_Style *bs,bool invert)

{
  Am_Font_Family_Flag AVar1;
  Am_Font_Size_Flag AVar2;
  long *plVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  Am_Font local_78 [8];
  ulong local_70;
  long local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  Am_Style *local_40;
  ulong local_38;
  
  test_string = "Egypt";
  test_str_len = 5;
  local_70 = (ulong)(uint)ar_len;
  local_48 = local_70 << 6;
  local_38 = (ulong)invert;
  lVar6 = 0;
  uVar8 = 0;
  local_40 = bs;
  do {
    AVar1 = test_font_variety::family_array[lVar6];
    uVar5 = 1;
    local_68 = lVar6;
    do {
      AVar2 = test_font_variety::size_array[uVar5];
      local_60 = uVar5;
      iVar4 = 0;
      do {
        uVar5 = 0;
        do {
          local_58 = uVar8;
          local_50 = uVar5;
          Am_Font::Am_Font(local_78,AVar1,false,iVar4 != 0,(int)uVar5 != 0,AVar2);
          Am_Font::operator=((Am_Font *)&test_font,local_78);
          Am_Font::~Am_Font(local_78);
          uVar8 = local_58;
          iVar7 = (int)local_58;
          if (0 < ar_len) {
            lVar6 = 0;
            do {
              plVar3 = *(long **)((long)&wins_ar->font_win + lVar6);
              (**(code **)(*plVar3 + 0xd0))
                        (plVar3,&test_font,test_string,test_str_len,&test_string_width,
                         &test_string_ascent,&test_string_descent,&test_string_left_bearing,
                         &test_string_right_bearing);
              test_string_height = test_string_descent + test_string_ascent;
              (**(code **)(*plVar3 + 0x170))
                        (plVar3,&Am_Black,test_string,test_str_len,&test_font,10,uVar8,0,local_40,
                         local_38);
              lVar9 = local_48;
              (**(code **)(*plVar3 + 0x160))
                        (plVar3,&black,&Am_No_Style,10,uVar8 & 0xffffffff,test_string_width,
                         test_string_height,0);
              lVar6 = lVar6 + 0x40;
            } while (lVar9 != lVar6);
          }
          uVar8 = (ulong)(iVar7 + test_string_height + 4);
          uVar5 = (ulong)((int)local_50 + 1);
        } while ((int)local_50 == 0);
        bVar10 = iVar4 == 0;
        iVar4 = iVar4 + 1;
      } while (bVar10);
      uVar5 = local_60 + 2;
    } while (local_60 < 2);
    lVar6 = local_68 + 1;
  } while (lVar6 != 3);
  if (0 < ar_len) {
    lVar9 = local_70 << 6;
    lVar6 = 0;
    do {
      (**(code **)(**(long **)((long)&wins_ar->font_win + lVar6) + 0xa0))();
      lVar6 = lVar6 + 0x40;
    } while (lVar9 != lVar6);
  }
  return;
}

Assistant:

void
test_font_variety(wins *wins_ar, int ar_len, Am_Style &bs, bool invert)
{
  // Since family_array and size_array are static, they persists across
  // multiple invocations of the enclosing function.  They will not be
  // reinitialized when the function is invoked a second time.
  static Am_Font_Family_Flag family_array[3] = {Am_FONT_FIXED, Am_FONT_SERIF,
                                                Am_FONT_SANS_SERIF};
  static Am_Font_Size_Flag size_array[4] = {Am_FONT_SMALL, Am_FONT_MEDIUM,
                                            Am_FONT_LARGE, Am_FONT_VERY_LARGE};
  int top = 0;
  test_string = "Egypt";
  test_str_len = 5;
  for (int fam = 0; fam < 3; fam++) {
    for (int size = 1; size < 4; size += 2) {
      for (int it = 0; it < 2; it++) {
        for (int under = 0; under < 2; under++) {
          test_font =
              Am_Font(family_array[fam], false, it, under, size_array[size]);

          for (int i = 0; i < ar_len; i++) {
            Am_Drawonable *font_win = wins_ar[i].font_win;
            update_font_numbers(font_win);

            font_win->Draw_Text(Am_Black, test_string, test_str_len, test_font,
                                10, top, Am_DRAW_COPY, bs, invert);
            font_win->Draw_Rectangle(black, Am_No_Style, 10, top,
                                     test_string_width, test_string_height);
          }
          top = top + test_string_height + 4;
        }
      }
    }
  }
  for (int i = 0; i < ar_len; i++) {
    (wins_ar[i].font_win)->Flush_Output();
  }
}